

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_numbers.c
# Opt level: O0

fio_str_info_s * fio_f2str(fio_str_info_s *__return_storage_ptr__,FIOBJ o)

{
  double dVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  long *in_FS_OFFSET;
  FIOBJ o_local;
  
  if (NAN(*(double *)((o & 0xfffffffffffffff8) + 8))) {
    __return_storage_ptr__->capa = 0;
    __return_storage_ptr__->len = 3;
    __return_storage_ptr__->data = "NaN";
  }
  else {
    dVar1 = *(double *)((o & 0xfffffffffffffff8) + 8);
    iVar4 = 1;
    if ((long)dVar1 < 0) {
      iVar4 = -1;
    }
    iVar2 = 0;
    if (ABS(dVar1) == INFINITY) {
      iVar2 = iVar4;
    }
    if (iVar2 == 0) {
      __return_storage_ptr__->capa = 0;
      sVar3 = fio_ftoa((char *)(*in_FS_OFFSET + -0x260),*(double *)((o & 0xfffffffffffffff8) + 8),
                       '\n');
      __return_storage_ptr__->len = sVar3;
      __return_storage_ptr__->data = (char *)(*in_FS_OFFSET + -0x260);
    }
    else if (*(double *)((o & 0xfffffffffffffff8) + 8) <= 0.0) {
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = 9;
      __return_storage_ptr__->data = "-Infinity";
    }
    else {
      __return_storage_ptr__->capa = 0;
      __return_storage_ptr__->len = 8;
      __return_storage_ptr__->data = "Infinity";
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static fio_str_info_s fio_f2str(const FIOBJ o) {
  if (isnan(obj2float(o)->f))
    return (fio_str_info_s){.data = (char *)"NaN", .len = 3};
  else if (isinf(obj2float(o)->f)) {
    if (obj2float(o)->f > 0)
      return (fio_str_info_s){.data = (char *)"Infinity", .len = 8};
    else
      return (fio_str_info_s){.data = (char *)"-Infinity", .len = 9};
  }
  return (fio_str_info_s){
      .data = num_buffer,
      .len = fio_ftoa(num_buffer, obj2float(o)->f, 10),
  };
}